

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

destructive_iterator * __thiscall
google::
sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::destructive_begin(destructive_iterator *__return_storage_ptr__,
                   sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this)

{
  pointer psVar1;
  pointer psVar2;
  destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
  local_30;
  
  psVar1 = (this->table).groups.
           super__Vector_base<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_30.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.col_current = (pointer)0x0;
  psVar2 = psVar1;
  local_30.row_begin._M_current = psVar1;
  local_30.row_current._M_current = psVar1;
  if (psVar1 != local_30.row_end._M_current) {
    local_30.col_current = psVar1->group;
    destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::advance_past_end(&local_30);
    psVar1 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar2 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  (__return_storage_ptr__->pos).row_current._M_current = local_30.row_current._M_current;
  (__return_storage_ptr__->pos).col_current = local_30.col_current;
  (__return_storage_ptr__->pos).row_begin._M_current = local_30.row_begin._M_current;
  (__return_storage_ptr__->pos).row_end._M_current = local_30.row_end._M_current;
  __return_storage_ptr__->ht = this;
  (__return_storage_ptr__->end).row_begin._M_current = psVar2;
  (__return_storage_ptr__->end).row_end._M_current = psVar1;
  (__return_storage_ptr__->end).row_current._M_current = psVar1;
  (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
  sparse_hashtable_destructive_iterator<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

destructive_iterator destructive_begin() {
    return destructive_iterator(this, table.destructive_begin(),
                                table.destructive_end());
  }